

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeBufferApiTests.cpp
# Opt level: O2

void deqp::gles31::Functional::NegativeTestShared::read_pixels_format_mismatch
               (NegativeTestContext *ctx)

{
  allocator<char> local_69;
  GLint readType;
  GLint readFormat;
  vector<unsigned_short,_std::allocator<unsigned_short>_> ushortData;
  string local_48;
  vector<unsigned_char,_std::allocator<unsigned_char>_> ubyteData;
  
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&ubyteData,4,(allocator_type *)&local_48);
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector
            (&ushortData,4,(allocator_type *)&local_48);
  readFormat = 0x1234;
  readType = 0x1234;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,
             "Unsupported combinations of format and type will generate an GL_INVALID_OPERATION error."
             ,&local_69);
  NegativeTestContext::beginSection(ctx,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  glu::CallLogWrapper::glReadPixels
            (&ctx->super_CallLogWrapper,0,0,1,1,0x1908,0x8363,
             ushortData.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
             super__Vector_impl_data._M_start);
  NegativeTestContext::expectError(ctx,0x502);
  glu::CallLogWrapper::glReadPixels
            (&ctx->super_CallLogWrapper,0,0,1,1,0x1906,0x8363,
             ushortData.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
             super__Vector_impl_data._M_start);
  NegativeTestContext::expectError(ctx,0x502);
  glu::CallLogWrapper::glReadPixels
            (&ctx->super_CallLogWrapper,0,0,1,1,0x1907,0x8033,
             ushortData.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
             super__Vector_impl_data._M_start);
  NegativeTestContext::expectError(ctx,0x502);
  glu::CallLogWrapper::glReadPixels
            (&ctx->super_CallLogWrapper,0,0,1,1,0x1906,0x8033,
             ushortData.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
             super__Vector_impl_data._M_start);
  NegativeTestContext::expectError(ctx,0x502);
  glu::CallLogWrapper::glReadPixels
            (&ctx->super_CallLogWrapper,0,0,1,1,0x1907,0x8034,
             ushortData.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
             super__Vector_impl_data._M_start);
  NegativeTestContext::expectError(ctx,0x502);
  glu::CallLogWrapper::glReadPixels
            (&ctx->super_CallLogWrapper,0,0,1,1,0x1906,0x8034,
             ushortData.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
             super__Vector_impl_data._M_start);
  NegativeTestContext::expectError(ctx,0x502);
  NegativeTestContext::endSection(ctx);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,
             "GL_RGBA/GL_UNSIGNED_BYTE is always accepted and the other acceptable pair can be discovered by querying GL_IMPLEMENTATION_COLOR_READ_FORMAT and GL_IMPLEMENTATION_COLOR_READ_TYPE."
             ,&local_69);
  NegativeTestContext::beginSection(ctx,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  glu::CallLogWrapper::glReadPixels
            (&ctx->super_CallLogWrapper,0,0,1,1,0x1908,0x1401,
             ubyteData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start);
  NegativeTestContext::expectError(ctx,0);
  glu::CallLogWrapper::glGetIntegerv(&ctx->super_CallLogWrapper,0x8b9b,&readFormat);
  glu::CallLogWrapper::glGetIntegerv(&ctx->super_CallLogWrapper,0x8b9a,&readType);
  glu::CallLogWrapper::glReadPixels
            (&ctx->super_CallLogWrapper,0,0,1,1,readFormat,readType,
             ubyteData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start);
  NegativeTestContext::expectError(ctx,0);
  NegativeTestContext::endSection(ctx);
  std::_Vector_base<unsigned_short,_std::allocator<unsigned_short>_>::~_Vector_base
            (&ushortData.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&ubyteData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  return;
}

Assistant:

void read_pixels_format_mismatch (NegativeTestContext& ctx)
{
	std::vector<GLubyte>	ubyteData	(4);
	std::vector<GLushort>	ushortData	(4);
	GLint					readFormat	= 0x1234;
	GLint					readType	= 0x1234;

	ctx.beginSection("Unsupported combinations of format and type will generate an GL_INVALID_OPERATION error.");
	ctx.glReadPixels(0, 0, 1, 1, GL_RGBA, GL_UNSIGNED_SHORT_5_6_5, &ushortData[0]);
	ctx.expectError(GL_INVALID_OPERATION);
	ctx.glReadPixels(0, 0, 1, 1, GL_ALPHA, GL_UNSIGNED_SHORT_5_6_5, &ushortData[0]);
	ctx.expectError(GL_INVALID_OPERATION);
	ctx.glReadPixels(0, 0, 1, 1, GL_RGB, GL_UNSIGNED_SHORT_4_4_4_4, &ushortData[0]);
	ctx.expectError(GL_INVALID_OPERATION);
	ctx.glReadPixels(0, 0, 1, 1, GL_ALPHA, GL_UNSIGNED_SHORT_4_4_4_4, &ushortData[0]);
	ctx.expectError(GL_INVALID_OPERATION);
	ctx.glReadPixels(0, 0, 1, 1, GL_RGB, GL_UNSIGNED_SHORT_5_5_5_1, &ushortData[0]);
	ctx.expectError(GL_INVALID_OPERATION);
	ctx.glReadPixels(0, 0, 1, 1, GL_ALPHA, GL_UNSIGNED_SHORT_5_5_5_1, &ushortData[0]);
	ctx.expectError(GL_INVALID_OPERATION);
	ctx.endSection();

	ctx.beginSection("GL_RGBA/GL_UNSIGNED_BYTE is always accepted and the other acceptable pair can be discovered by querying GL_IMPLEMENTATION_COLOR_READ_FORMAT and GL_IMPLEMENTATION_COLOR_READ_TYPE.");
	ctx.glReadPixels(0, 0, 1, 1, GL_RGBA, GL_UNSIGNED_BYTE, &ubyteData[0]);
	ctx.expectError(GL_NO_ERROR);
	ctx.glGetIntegerv(GL_IMPLEMENTATION_COLOR_READ_FORMAT, &readFormat);
	ctx.glGetIntegerv(GL_IMPLEMENTATION_COLOR_READ_TYPE, &readType);
	ctx.glReadPixels(0, 0, 1, 1, readFormat, readType, &ubyteData[0]);
	ctx.expectError(GL_NO_ERROR);
	ctx.endSection();
}